

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::passHessian(Highs *this,HighsHessian *hessian_)

{
  HighsHessian *this_00;
  HighsLogOptions *log_options_;
  pointer pdVar1;
  bool bVar2;
  HighsStatus HVar3;
  HighsStatus from_return_status;
  HighsInt HVar4;
  HighsInt iEl;
  long lVar5;
  allocator local_119;
  double local_118;
  string local_110;
  HighsLogOptions local_f0;
  HighsLogOptions local_90;
  
  logHeader(this);
  this_00 = &(this->model_).hessian_;
  HighsHessian::operator=(this_00,hessian_);
  log_options_ = &(this->options_).super_HighsOptionsStruct.log_options;
  HighsLogOptions::HighsLogOptions(&local_90,log_options_);
  HVar3 = assessHessian(this_00,&this->options_);
  std::__cxx11::string::string((string *)&local_110,"assessHessian",&local_119);
  from_return_status = interpretCallStatus(&local_90,HVar3,kOk,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::_Function_base::~_Function_base(&local_90.user_callback.super__Function_base);
  HVar3 = kError;
  if (from_return_status != kError) {
    if (this_00->dim_ != 0) {
      HVar4 = HighsHessian::numNz(this_00);
      if (HVar4 == 0) {
        highsLogUser(log_options_,kInfo,"Hessian has dimension %d but no nonzeros, so is ignored\n",
                     (ulong)(uint)this_00->dim_);
        HighsHessian::clear(this_00);
      }
      if (this_00->dim_ != 0) {
        completeHessian((this->model_).lp_.num_col_,this_00);
      }
    }
    HVar4 = (this->model_).lp_.user_cost_scale_;
    if (HVar4 != 0) {
      bVar2 = HighsHessian::scaleOk
                        (this_00,HVar4,(this->options_).super_HighsOptionsStruct.small_matrix_value,
                         (this->options_).super_HighsOptionsStruct.large_matrix_value);
      if (!bVar2) {
        highsLogUser(log_options_,kError,
                     "User cost scaling yields zeroed or excessive Hessian values\n");
        return kError;
      }
      local_118 = ldexp(1.0,(this->model_).lp_.user_cost_scale_);
      for (lVar5 = 0; HVar4 = HighsHessian::numNz(this_00), lVar5 < HVar4; lVar5 = lVar5 + 1) {
        pdVar1 = (this->model_).hessian_.value_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar1[lVar5] = pdVar1[lVar5] * local_118;
      }
    }
    HighsLogOptions::HighsLogOptions(&local_f0,log_options_);
    HVar3 = clearSolver(this);
    std::__cxx11::string::string((string *)&local_110,"clearSolver",&local_119);
    HVar3 = interpretCallStatus(&local_f0,HVar3,from_return_status,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::_Function_base::~_Function_base(&local_f0.user_callback.super__Function_base);
    HVar3 = returnFromHighs(this,HVar3);
  }
  return HVar3;
}

Assistant:

HighsStatus Highs::passHessian(HighsHessian hessian_) {
  this->logHeader();
  HighsStatus return_status = HighsStatus::kOk;
  HighsHessian& hessian = model_.hessian_;
  hessian = std::move(hessian_);
  // Check validity of any Hessian, normalising its entries
  return_status = interpretCallStatus(options_.log_options,
                                      assessHessian(hessian, options_),
                                      return_status, "assessHessian");
  if (return_status == HighsStatus::kError) return return_status;
  if (hessian.dim_) {
    // Clear any zero Hessian
    if (hessian.numNz() == 0) {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Hessian has dimension %" HIGHSINT_FORMAT
                   " but no nonzeros, so is ignored\n",
                   hessian.dim_);
      hessian.clear();
    }
  }
  // Ensure that any non-zero Hessian of dimension less than the
  // number of columns in the model is completed
  if (hessian.dim_) completeHessian(this->model_.lp_.num_col_, hessian);

  if (this->model_.lp_.user_cost_scale_) {
    // Assess and apply any user cost scaling
    if (!hessian.scaleOk(this->model_.lp_.user_cost_scale_,
                         this->options_.small_matrix_value,
                         this->options_.large_matrix_value)) {
      highsLogUser(
          options_.log_options, HighsLogType::kError,
          "User cost scaling yields zeroed or excessive Hessian values\n");
      return HighsStatus::kError;
    }
    double cost_scale_value = std::pow(2, this->model_.lp_.user_cost_scale_);
    for (HighsInt iEl = 0; iEl < hessian.numNz(); iEl++)
      hessian.value_[iEl] *= cost_scale_value;
  }
  return_status = interpretCallStatus(options_.log_options, clearSolver(),
                                      return_status, "clearSolver");
  return returnFromHighs(return_status);
}